

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TexSubImageCubeEmptyTexCase::createTexture
          (TexSubImageCubeEmptyTexCase *this)

{
  deUint32 format;
  deUint32 type;
  float height;
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  char *str;
  void *data_00;
  int local_144;
  PixelBufferAccess local_138;
  PixelBufferAccess local_110;
  Vector<float,_4> local_e4;
  Vector<float,_4> local_d4;
  undefined1 local_c4 [8];
  Vec4 gMax;
  Vector<float,_4> local_a4;
  undefined1 local_94 [8];
  Vec4 gMin;
  int face_1;
  int levelH_1;
  int levelW_1;
  int ndx_1;
  int face;
  int levelH;
  int levelW;
  int ndx;
  undefined1 local_58 [8];
  Random rnd;
  TextureLevel data;
  deUint32 tex;
  int numLevels;
  TextureFormat fmt;
  TexSubImageCubeEmptyTexCase *this_local;
  
  _tex = (this->super_TextureSpecCase).m_texFormat;
  fmt = (TextureFormat)this;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_144 = 1;
  }
  else {
    iVar1 = ::deLog2Floor32((this->super_TextureSpecCase).m_width);
    iVar2 = ::deLog2Floor32((this->super_TextureSpecCase).m_height);
    local_144 = de::max<int>(iVar1,iVar2);
    local_144 = local_144 + 1;
  }
  data.m_data.m_cap._4_4_ = local_144;
  data.m_data.m_cap._0_4_ = 0;
  tcu::TextureLevel::TextureLevel((TextureLevel *)&rnd.m_rnd.z,(TextureFormat *)&tex);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)local_58,dVar3);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureSpecCase).super_ContextWrapper,1,(deUint32 *)&data.m_data.m_cap);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureSpecCase).super_ContextWrapper,0x8513,(deUint32)data.m_data.m_cap)
  ;
  sglr::ContextWrapper::glPixelStorei(&(this->super_TextureSpecCase).super_ContextWrapper,0xcf5,1);
  for (levelH = 0; levelH < data.m_data.m_cap._4_4_; levelH = levelH + 1) {
    iVar1 = de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH & 0x1f));
    iVar2 = de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH & 0x1f));
    for (levelW_1 = 0; levelW_1 < 6; levelW_1 = levelW_1 + 1) {
      sglr::ContextWrapper::glTexImage2D
                (&(this->super_TextureSpecCase).super_ContextWrapper,
                 *(deUint32 *)(s_cubeMapFaces + (long)levelW_1 * 4),levelH,this->m_format,iVar1,
                 iVar2,0,this->m_format,this->m_dataType,(void *)0x0);
    }
  }
  for (levelH_1 = 0; levelH_1 < data.m_data.m_cap._4_4_; levelH_1 = levelH_1 + 1) {
    iVar1 = de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelH_1 & 0x1f));
    gMin.m_data[3] =
         (float)de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelH_1 & 0x1f));
    tcu::TextureLevel::setSize((TextureLevel *)&rnd.m_rnd.z,iVar1,(int)gMin.m_data[3],1);
    for (gMin.m_data[2] = 0.0; (int)gMin.m_data[2] < 6;
        gMin.m_data[2] = (float)((int)gMin.m_data[2] + 1)) {
      tcu::Vector<float,_4>::Vector(&local_a4,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),1.0);
      randomVector<4>((Functional *)local_94,(Random *)local_58,&local_a4,
                      (Vector<float,_4> *)(gMax.m_data + 2));
      tcu::Vector<float,_4>::Vector(&local_d4,0.0);
      tcu::Vector<float,_4>::Vector(&local_e4,1.0);
      randomVector<4>((Functional *)local_c4,(Random *)local_58,&local_d4,&local_e4);
      tcu::TextureLevel::getAccess(&local_110,(TextureLevel *)&rnd.m_rnd.z);
      tcu::fillWithComponentGradients(&local_110,(Vec4 *)local_94,(Vec4 *)local_c4);
      height = gMin.m_data[3];
      dVar3 = *(deUint32 *)(s_cubeMapFaces + (long)(int)gMin.m_data[2] * 4);
      format = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_138,(TextureLevel *)&rnd.m_rnd.z);
      data_00 = tcu::PixelBufferAccess::getDataPtr(&local_138);
      sglr::ContextWrapper::glTexSubImage2D
                (&(this->super_TextureSpecCase).super_ContextWrapper,dVar3,levelH_1,0,0,iVar1,
                 (int)height,format,type,data_00);
    }
  }
  de::Random::~Random((Random *)local_58);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&rnd.m_rnd.z);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(fmt);
		de::Random			rnd			(deStringHash(getName()));

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// Specify storage for each level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, DE_NULL);
		}

		// Specify data using glTexSubImage2D()
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			data.setSize(levelW, levelH);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd);
				Vec4 gMax = randomVector<4>(rnd);

				tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

				glTexSubImage2D(s_cubeMapFaces[face], ndx, 0, 0, levelW, levelH, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}
	}